

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# w3interp.cpp
# Opt level: O1

void __thiscall w3Interp::BrIf(w3Interp *this)

{
  pointer *ppwVar1;
  uint uVar2;
  Value *pVVar3;
  ulong uVar4;
  
  pVVar3 = w3Stack::value(&this->super_w3Stack,Tag_i32);
  uVar2 = pVVar3->u32;
  w3Stack::AssertTopIsValue(&this->super_w3Stack);
  ppwVar1 = &(this->super_w3Stack).super_w3StackBase.super_w3StackBaseBase.
             super__Vector_base<w3StackValue,_std::allocator<w3StackValue>_>._M_impl.
             super__Vector_impl_data._M_finish;
  *ppwVar1 = *ppwVar1 + -1;
  uVar4 = (ulong)(((this->super_Wasm).instr)->super_w3DecodedInstructionZeroInit).field_0.u32;
  if (uVar2 != 0) {
    printf("BrIfTaken condition:%X label:%X\n",(ulong)uVar2,uVar4);
    Br(this);
    return;
  }
  printf("BrIfNotTaken condition:%X label:%X\n",0,uVar4);
  return;
}

Assistant:

INTERP (BrIf)
{
    //DumpStack ("brIfStart");

    const uint32_t condition = pop_u32 ();

    if (condition)
    {
        printf ("BrIfTaken condition:%X label:%X\n", condition, instr->u32);
        Br ();
    }
    else
    {
        printf ("BrIfNotTaken condition:%X label:%X\n", condition, instr->u32);
    }
    //DumpStack ("brIfEnd");
}